

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,uint i,ON_SubDFacePtr *removed_face)

{
  ushort uVar1;
  ON_SubDFacePtr *__dest;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  removed_face->m_ptr = (ON__UINT_PTR)(ON_SubDFacePtr)0x0;
  uVar1 = this->m_face_count;
  if (i < uVar1) {
    if (i < 2) {
      removed_face->m_ptr = this->m_face2[i].m_ptr;
    }
    if (2 < uVar1) {
      if ((this->m_facex == (ON_SubDFacePtr *)0x0) || (this->m_facex_capacity + 2 < (uint)uVar1))
      goto LAB_005cd135;
      if (1 < i) {
        removed_face->m_ptr = this->m_facex[(ulong)i - 2].m_ptr;
      }
    }
    uVar4 = (uint)uVar1;
    uVar3 = 2;
    if (uVar4 < 2) {
      uVar3 = uVar4;
    }
    if (i + 1 < uVar3) {
      this->m_face2[i].m_ptr = this->m_face2[1].m_ptr;
    }
    if (2 < uVar1) {
      __dest = this->m_facex;
      this->m_face2[1].m_ptr = __dest->m_ptr;
      if ((uVar4 & 0xfffffffe) != 2) {
        memmove(__dest,__dest + 1,(ulong)(uVar1 - 3) << 3);
      }
    }
    this->m_face_count = uVar1 - 1;
    bVar2 = true;
  }
  else {
LAB_005cd135:
    ON_SubDIncrementErrorCount();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  unsigned int i,
  ON_SubDFacePtr& removed_face
  )
{
  removed_face = ON_SubDFacePtr::Null;
  unsigned int count = m_face_count;
  if ( i >= count )
    return ON_SUBD_RETURN_ERROR(false);
  if (i < 2)
  {
    removed_face = m_face2[i];
  }
  if (count > 2)
  {
    if ( nullptr == m_facex || m_facex_capacity + ((unsigned short)2) < m_face_count )
      return ON_SUBD_RETURN_ERROR(false);
    if ( i >= 2 )
      removed_face = m_facex[i-2];
  }

  unsigned int j = i+1U;

  while (j < 2 && j < count)
  {
    // NOTE: 
    // 0 <= i < j < min(2,count) <= 2 so any warning that the following line may 
    // result in an invalid write is incorrect.
    m_face2[i++] = m_face2[j++];
  }

  if (count > 2)
  {
    m_face2[1] = m_facex[0];
    i = 0;
    j = 1;
    count -= 2;
    while (j < count )
      m_facex[i++] = m_facex[j++];
  }

  m_face_count--;

  return true;

}